

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::_q_sslErrors
          (QHttpNetworkConnectionChannel *this,QList<QSslError> *errors)

{
  long lVar1;
  bool bVar2;
  ConnectionType CVar3;
  QHttpNetworkReply *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *currentReply;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *httpMessagePair;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> h2RequestsToSendCopy;
  QList<QSslError> *in_stack_ffffffffffffffa8;
  QIODevice *in_stack_ffffffffffffffb8;
  QHttpNetworkConnectionPrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader != (_func_int **)0x0) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f8c27);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f8c2f);
    QHttpNetworkConnectionPrivate::pauseConnection(in_stack_ffffffffffffffc0);
    if ((((ulong)in_RDI[3].super_QHttpNetworkHeader._vptr_QHttpNetworkHeader & 1) != 0) &&
       (*(long *)&in_RDI[2].field_0x8 == 0)) {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f8c5f);
      QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f8c67);
      QHttpNetworkConnectionPrivate::dequeueRequest
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f8c89);
    CVar3 = QHttpNetworkConnection::connectionType((QHttpNetworkConnection *)in_RDI);
    if (CVar3 == ConnectionTypeHTTP) {
      if (*(long *)&in_RDI[2].field_0x8 != 0) {
        QHttpNetworkReply::sslErrors(in_RDI,in_stack_ffffffffffffffa8);
      }
    }
    else {
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QMultiMap
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                 (QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 in_stack_ffffffffffffffa8);
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 in_stack_ffffffffffffffc0);
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 in_stack_ffffffffffffffc0);
      while (bVar2 = ::operator!=((const_iterator *)in_RDI,
                                  (const_iterator *)in_stack_ffffffffffffffa8), bVar2) {
        in_stack_ffffffffffffffc0 =
             (QHttpNetworkConnectionPrivate *)
             QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
             operator*((const_iterator *)0x2f8d59);
        QHttpNetworkReply::sslErrors(in_RDI,in_stack_ffffffffffffffa8);
        QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
        operator++((const_iterator *)in_RDI);
      }
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::~QMultiMap
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2f8d91);
    }
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f8da2);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f8daa);
    QHttpNetworkConnectionPrivate::resumeConnection(in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::_q_sslErrors(const QList<QSslError> &errors)
{
    if (!socket)
        return;
    //QNetworkReply::NetworkError errorCode = QNetworkReply::ProtocolFailure;
    // Also pause the connection because socket notifiers may fire while an user
    // dialog is displaying
    connection->d_func()->pauseConnection();
    if (pendingEncrypt && !reply)
        connection->d_func()->dequeueRequest(socket);
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP) {
        if (reply)
            emit reply->sslErrors(errors);
    }
#ifndef QT_NO_SSL
    else { // HTTP/2
        const auto h2RequestsToSendCopy = h2RequestsToSend;
        for (const auto &httpMessagePair : h2RequestsToSendCopy) {
            // emit SSL errors for all replies
            QHttpNetworkReply *currentReply = httpMessagePair.second;
            Q_ASSERT(currentReply);
            emit currentReply->sslErrors(errors);
        }
    }
#endif // QT_NO_SSL
    connection->d_func()->resumeConnection();
}